

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initJavaData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> QStack_538;
  pair<char,_QLatin1String> local_528;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_528.first = 'a';
  local_528.second.m_size = 8;
  local_528.second.m_data = "abstract";
  local_510 = 0x61;
  local_508 = 6;
  local_500 = "assert";
  local_4f8 = 0x62;
  local_4f0 = 5;
  local_4e8 = "break";
  local_4e0 = 99;
  local_4d8 = 4;
  local_4d0 = "case";
  local_4c8 = 99;
  local_4c0 = 5;
  local_4b8 = "catch";
  local_4b0 = 99;
  local_4a8 = 5;
  local_4a0 = "const";
  local_498 = 99;
  local_490 = 8;
  local_488 = "continue";
  local_480 = 100;
  local_478 = 7;
  local_470 = "default";
  local_468 = 100;
  local_460 = 2;
  local_458 = "do";
  local_450 = 0x65;
  local_448 = 4;
  local_440 = "else";
  local_438 = 0x65;
  local_430 = 7;
  local_428 = "exports";
  local_420 = 0x65;
  local_418 = 7;
  local_410 = "extends";
  local_408 = 0x66;
  local_400 = 5;
  local_3f8 = "final";
  local_3f0 = 0x66;
  local_3e8 = 7;
  local_3e0 = "finally";
  local_3d8 = 0x66;
  local_3d0 = 3;
  local_3c8 = "for";
  local_3c0 = 0x67;
  local_3b8 = 4;
  local_3b0 = "goto";
  local_3a8 = 0x69;
  local_3a0 = 2;
  local_398 = "if";
  local_390 = 0x69;
  local_388 = 10;
  local_380 = "implements";
  local_378 = 0x69;
  local_370 = 6;
  local_368 = "import";
  local_360 = 0x69;
  local_358 = 10;
  local_350 = "instanceof";
  local_348 = 0x69;
  local_340 = 9;
  local_338 = "interface";
  local_330 = 0x6c;
  local_328 = 4;
  local_320 = "long";
  local_318 = 0x6d;
  local_310 = 6;
  local_308 = "module";
  local_300 = 0x6e;
  local_2f8 = 6;
  local_2f0 = "native";
  local_2e8 = 0x6e;
  local_2e0 = 3;
  local_2d8 = "new";
  local_2d0 = 0x6e;
  local_2c8 = 4;
  local_2c0 = "null";
  local_2b8 = 0x6f;
  local_2b0 = 4;
  local_2a8 = "open";
  local_2a0 = 0x6f;
  local_298 = 5;
  local_290 = "opens";
  local_288 = 0x70;
  local_280 = 7;
  local_278 = "package";
  local_270 = 0x70;
  local_268 = 7;
  local_260 = "private";
  local_258 = 0x70;
  local_250 = 9;
  local_248 = "protected";
  local_240 = 0x70;
  local_238 = 8;
  local_230 = "provides";
  local_228 = 0x70;
  local_220 = 6;
  local_218 = "public";
  local_210 = 0x72;
  local_208 = 8;
  local_200 = "requires";
  local_1f8 = 0x72;
  local_1f0 = 6;
  local_1e8 = "return";
  local_1e0 = 0x73;
  local_1d8 = 6;
  local_1d0 = "static";
  local_1c8 = 0x73;
  local_1c0 = 8;
  local_1b8 = "strictfp";
  local_1b0 = 0x73;
  local_1a8 = 5;
  local_1a0 = "super";
  local_198 = 0x73;
  local_190 = 6;
  local_188 = "switch";
  local_180 = 0x73;
  local_178 = 0xc;
  local_170 = "synchronized";
  local_168 = 0x74;
  local_160 = 4;
  local_158 = "this";
  local_150 = 0x74;
  local_148 = 5;
  local_140 = "throw";
  local_138 = 0x74;
  local_130 = 6;
  local_128 = "throws";
  local_120 = 0x74;
  local_118 = 2;
  local_110 = "to";
  local_108 = 0x74;
  local_100 = 9;
  local_f8 = "transient";
  local_f0 = 0x74;
  local_e8 = 10;
  local_e0 = "transitive";
  local_d8 = 0x74;
  local_d0 = 3;
  local_c8 = "try";
  local_c0 = 0x75;
  local_b8 = 4;
  local_b0 = "uses";
  local_a8 = 0x76;
  local_a0 = 3;
  local_98 = "var";
  local_90 = 0x76;
  local_88 = 8;
  local_80 = "volatile";
  local_78 = 0x77;
  local_70 = 5;
  local_68 = "while";
  local_60 = 0x77;
  local_58 = 4;
  local_50 = "with";
  local_48 = 0x79;
  local_40 = 5;
  local_38 = "yield";
  list._M_len = 0x35;
  list._M_array = &local_528;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_538,list);
  QMultiHash<char,_QLatin1String>::operator=(&java_keywords,&QStack_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_538);
  local_528.first = 'v';
  local_528.second.m_size = 4;
  local_528.second.m_data = "void";
  local_510 = 0x66;
  local_508 = 5;
  local_500 = "float";
  local_4f8 = 0x62;
  local_4f0 = 7;
  local_4e8 = "boolean";
  local_4e0 = 0x62;
  local_4d8 = 4;
  local_4d0 = "byte";
  local_4c8 = 0x69;
  local_4c0 = 3;
  local_4b8 = "int";
  local_4b0 = 99;
  local_4a8 = 4;
  local_4a0 = "char";
  local_498 = 99;
  local_490 = 5;
  local_488 = "class";
  local_480 = 100;
  local_478 = 6;
  local_470 = "double";
  local_468 = 0x65;
  local_460 = 4;
  local_458 = "enum";
  local_450 = 0x73;
  local_448 = 5;
  local_440 = "short";
  list_00._M_len = 10;
  list_00._M_array = &local_528;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_538,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&java_types,&QStack_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_538);
  local_528.first = 'f';
  local_528.second.m_size = 5;
  local_528.second.m_data = "false";
  local_510 = 0x74;
  local_508 = 4;
  local_500 = "true";
  list_01._M_len = 2;
  list_01._M_array = &local_528;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_538,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&java_literals,&QStack_538);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_538);
  local_528.first = '\0';
  local_528._1_7_ = 0;
  local_528.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&java_builtin,(QMultiHash<char,_QLatin1String> *)&local_528);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_528);
  local_528.first = '\0';
  local_528._1_7_ = 0;
  local_528.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&java_other,(QMultiHash<char,_QLatin1String> *)&local_528);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_528);
  return;
}

Assistant:

void initJavaData() {
    java_keywords = {{('a'), QLatin1String("abstract")},
                     {('a'), QLatin1String("assert")},
                     {('b'), QLatin1String("break")},
                     {('c'), QLatin1String("case")},
                     {('c'), QLatin1String("catch")},
                     {('c'), QLatin1String("const")},
                     {('c'), QLatin1String("continue")},
                     {('d'), QLatin1String("default")},
                     {('d'), QLatin1String("do")},
                     {('e'), QLatin1String("else")},
                     {('e'), QLatin1String("exports")},
                     {('e'), QLatin1String("extends")},
                     {('f'), QLatin1String("final")},
                     {('f'), QLatin1String("finally")},
                     {('f'), QLatin1String("for")},
                     {('g'), QLatin1String("goto")},
                     {('i'), QLatin1String("if")},
                     {('i'), QLatin1String("implements")},
                     {('i'), QLatin1String("import")},
                     {('i'), QLatin1String("instanceof")},
                     {('i'), QLatin1String("interface")},
                     {('l'), QLatin1String("long")},
                     {('m'), QLatin1String("module")},
                     {('n'), QLatin1String("native")},
                     {('n'), QLatin1String("new")},
                     {('n'), QLatin1String("null")},
                     {('o'), QLatin1String("open")},
                     {('o'), QLatin1String("opens")},
                     {('p'), QLatin1String("package")},
                     {('p'), QLatin1String("private")},
                     {('p'), QLatin1String("protected")},
                     {('p'), QLatin1String("provides")},
                     {('p'), QLatin1String("public")},
                     {('r'), QLatin1String("requires")},
                     {('r'), QLatin1String("return")},
                     {('s'), QLatin1String("static")},
                     {('s'), QLatin1String("strictfp")},
                     {('s'), QLatin1String("super")},
                     {('s'), QLatin1String("switch")},
                     {('s'), QLatin1String("synchronized")},
                     {('t'), QLatin1String("this")},
                     {('t'), QLatin1String("throw")},
                     {('t'), QLatin1String("throws")},
                     {('t'), QLatin1String("to")},
                     {('t'), QLatin1String("transient")},
                     {('t'), QLatin1String("transitive")},
                     {('t'), QLatin1String("try")},
                     {('u'), QLatin1String("uses")},
                     {('v'), QLatin1String("var")},
                     {('v'), QLatin1String("volatile")},
                     {('w'), QLatin1String("while")},
                     {('w'), QLatin1String("with")},
                     {('y'), QLatin1String("yield")}};

    java_types = {
        {('v'), QLatin1String("void")},    {('f'), QLatin1String("float")},
        {('b'), QLatin1String("boolean")}, {('b'), QLatin1String("byte")},
        {('i'), QLatin1String("int")},     {('c'), QLatin1String("char")},
        {('c'), QLatin1String("class")},   {('d'), QLatin1String("double")},
        {('e'), QLatin1String("enum")},    {('s'), QLatin1String("short")},

    };

    java_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    java_builtin = {

    };

    java_other = {

    };
}